

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateElementDecl(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlElementPtr elem)

{
  _xmlElementContent *p_Var1;
  int iVar2;
  xmlChar *pxVar3;
  xmlElementPtr pxVar4;
  xmlChar *pxVar5;
  xmlElementContentPtr pxVar6;
  _xmlElementContent *p_Var7;
  char *pcVar8;
  xmlChar *pxVar9;
  int local_48;
  xmlChar *prefix;
  
  local_48 = 0;
  if ((doc != (xmlDocPtr)0x0) &&
     ((doc->intSubset != (_xmlDtd *)0x0 || (doc->extSubset != (_xmlDtd *)0x0)))) {
    if (elem == (xmlElementPtr)0x0) {
      local_48 = 1;
    }
    else {
      local_48 = 1;
      if ((elem->etype == XML_ELEMENT_TYPE_MIXED) &&
         (pxVar6 = elem->content, pxVar6 != (xmlElementContentPtr)0x0)) {
        local_48 = 1;
        do {
          if ((pxVar6->type != XML_ELEMENT_CONTENT_OR) ||
             (p_Var1 = pxVar6->c1, p_Var1 == (_xmlElementContent *)0x0)) break;
          if ((p_Var1->type == XML_ELEMENT_CONTENT_ELEMENT) &&
             (p_Var7 = pxVar6->c2, p_Var7 != (_xmlElementContent *)0x0)) {
            pxVar3 = p_Var1->name;
            while (p_Var7->type != XML_ELEMENT_CONTENT_ELEMENT) {
              p_Var1 = p_Var7->c1;
              if ((p_Var1 == (_xmlElementContent *)0x0) ||
                 (p_Var1->type != XML_ELEMENT_CONTENT_ELEMENT)) goto LAB_0015a4c5;
              iVar2 = xmlStrEqual(p_Var1->name,pxVar3);
              if ((iVar2 != 0) &&
                 (iVar2 = xmlStrEqual(p_Var7->c1->prefix,pxVar6->c1->prefix), iVar2 != 0)) {
                pxVar5 = pxVar6->c1->prefix;
                if (pxVar5 == (xmlChar *)0x0) {
                  pxVar9 = (xmlChar *)0x0;
                  pcVar8 = "Definition of %s has duplicate references to %s\n";
                  pxVar5 = pxVar3;
                }
                else {
                  pcVar8 = "Definition of %s has duplicate references to %s:%s\n";
                  pxVar9 = pxVar3;
                }
                local_48 = 0;
                xmlDoErrValid(ctxt,(xmlNodePtr)elem,XML_DTD_CONTENT_ERROR,2,elem->name,pxVar5,pxVar9
                              ,0,pcVar8,elem->name,pxVar5,pxVar9);
              }
              p_Var7 = p_Var7->c2;
              if (p_Var7 == (_xmlElementContent *)0x0) goto LAB_0015a4c5;
            }
            iVar2 = xmlStrEqual(p_Var7->name,pxVar3);
            if ((iVar2 != 0) && (iVar2 = xmlStrEqual(p_Var7->prefix,pxVar6->c1->prefix), iVar2 != 0)
               ) {
              pxVar5 = pxVar6->c1->prefix;
              if (pxVar5 == (xmlChar *)0x0) {
                pxVar9 = (xmlChar *)0x0;
                pcVar8 = "Definition of %s has duplicate references of %s\n";
                pxVar5 = pxVar3;
              }
              else {
                pcVar8 = "Definition of %s has duplicate references of %s:%s\n";
                pxVar9 = pxVar3;
              }
              local_48 = 0;
              xmlDoErrValid(ctxt,(xmlNodePtr)elem,XML_DTD_CONTENT_ERROR,2,elem->name,pxVar5,pxVar9,0
                            ,pcVar8,elem->name,pxVar5,pxVar9);
            }
          }
LAB_0015a4c5:
          pxVar6 = pxVar6->c2;
        } while (pxVar6 != (_xmlElementContent *)0x0);
      }
      pxVar3 = xmlSplitQName4(elem->name,&prefix);
      if (pxVar3 == (xmlChar *)0x0) {
        xmlVErrMemory(ctxt);
        local_48 = 0;
      }
      else {
        if ((doc->intSubset != (_xmlDtd *)0x0) &&
           (pxVar4 = (xmlElementPtr)
                     xmlHashLookup2((xmlHashTablePtr)doc->intSubset->elements,pxVar3,prefix),
           pxVar4 != elem && pxVar4 != (xmlElementPtr)0x0)) {
          if (((pxVar4->prefix == elem->prefix) ||
              (iVar2 = xmlStrEqual(pxVar4->prefix,elem->prefix), iVar2 != 0)) &&
             (pxVar4->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            local_48 = 0;
            xmlDoErrValid(ctxt,(xmlNodePtr)elem,XML_DTD_ELEM_REDEFINED,2,elem->name,(xmlChar *)0x0,
                          (xmlChar *)0x0,0,"Redefinition of element %s\n",elem->name,0,0);
          }
        }
        if ((doc->extSubset != (_xmlDtd *)0x0) &&
           (pxVar4 = (xmlElementPtr)
                     xmlHashLookup2((xmlHashTablePtr)doc->extSubset->elements,pxVar3,prefix),
           pxVar4 != elem && pxVar4 != (xmlElementPtr)0x0)) {
          if (((pxVar4->prefix == elem->prefix) ||
              (iVar2 = xmlStrEqual(pxVar4->prefix,elem->prefix), iVar2 != 0)) &&
             (pxVar4->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            local_48 = 0;
            xmlDoErrValid(ctxt,(xmlNodePtr)elem,XML_DTD_ELEM_REDEFINED,2,elem->name,(xmlChar *)0x0,
                          (xmlChar *)0x0,0,"Redefinition of element %s\n",elem->name,0,0);
          }
        }
        (*xmlFree)(prefix);
      }
    }
  }
  return local_48;
}

Assistant:

int
xmlValidateElementDecl(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlElementPtr elem) {
    int ret = 1;
    xmlElementPtr tst;
    const xmlChar *localName;
    xmlChar *prefix;

    CHECK_DTD;

    if (elem == NULL) return(1);

    /* No Duplicate Types */
    if (elem->etype == XML_ELEMENT_TYPE_MIXED) {
	xmlElementContentPtr cur, next;
        const xmlChar *name;

	cur = elem->content;
	while (cur != NULL) {
	    if (cur->type != XML_ELEMENT_CONTENT_OR) break;
	    if (cur->c1 == NULL) break;
	    if (cur->c1->type == XML_ELEMENT_CONTENT_ELEMENT) {
		name = cur->c1->name;
		next = cur->c2;
		while (next != NULL) {
		    if (next->type == XML_ELEMENT_CONTENT_ELEMENT) {
		        if ((xmlStrEqual(next->name, name)) &&
			    (xmlStrEqual(next->prefix, cur->c1->prefix))) {
			    if (cur->c1->prefix == NULL) {
				xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
		   "Definition of %s has duplicate references of %s\n",
				       elem->name, name, NULL);
			    } else {
				xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
		   "Definition of %s has duplicate references of %s:%s\n",
				       elem->name, cur->c1->prefix, name);
			    }
			    ret = 0;
			}
			break;
		    }
		    if (next->c1 == NULL) break;
		    if (next->c1->type != XML_ELEMENT_CONTENT_ELEMENT) break;
		    if ((xmlStrEqual(next->c1->name, name)) &&
		        (xmlStrEqual(next->c1->prefix, cur->c1->prefix))) {
			if (cur->c1->prefix == NULL) {
			    xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
	       "Definition of %s has duplicate references to %s\n",
				   elem->name, name, NULL);
			} else {
			    xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
	       "Definition of %s has duplicate references to %s:%s\n",
				   elem->name, cur->c1->prefix, name);
			}
			ret = 0;
		    }
		    next = next->c2;
		}
	    }
	    cur = cur->c2;
	}
    }

    localName = xmlSplitQName4(elem->name, &prefix);
    if (localName == NULL) {
        xmlVErrMemory(ctxt);
        return(0);
    }

    /* VC: Unique Element Type Declaration */
    if (doc->intSubset != NULL) {
        tst = xmlHashLookup2(doc->intSubset->elements, localName, prefix);

        if ((tst != NULL ) && (tst != elem) &&
            ((tst->prefix == elem->prefix) ||
             (xmlStrEqual(tst->prefix, elem->prefix))) &&
            (tst->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_ELEM_REDEFINED,
                            "Redefinition of element %s\n",
                           elem->name, NULL, NULL);
            ret = 0;
        }
    }
    if (doc->extSubset != NULL) {
        tst = xmlHashLookup2(doc->extSubset->elements, localName, prefix);

        if ((tst != NULL ) && (tst != elem) &&
            ((tst->prefix == elem->prefix) ||
             (xmlStrEqual(tst->prefix, elem->prefix))) &&
            (tst->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_ELEM_REDEFINED,
                            "Redefinition of element %s\n",
                           elem->name, NULL, NULL);
            ret = 0;
        }
    }

    /* One ID per Element Type
     * already done when registering the attribute
    if (xmlScanIDAttributeDecl(ctxt, elem) > 1) {
	ret = 0;
    } */

    xmlFree(prefix);
    return(ret);
}